

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall btCompoundLeafCallback::Process(btCompoundLeafCallback *this,btDbvtNode *leaf)

{
  btCompoundShape *in_RDI;
  btCollisionShape *childShape;
  btCompoundShape *compoundShape;
  int index;
  int in_stack_00000104;
  btCollisionShape *in_stack_00000108;
  btCompoundLeafCallback *in_stack_00000110;
  int in_stack_ffffffffffffffcc;
  
  btCollisionObjectWrapper::getCollisionShape
            (*(btCollisionObjectWrapper **)&(in_RDI->super_btCollisionShape).m_shapeType);
  btCompoundShape::getChildShape(in_RDI,in_stack_ffffffffffffffcc);
  ProcessChildShape(in_stack_00000110,in_stack_00000108,in_stack_00000104);
  return;
}

Assistant:

void		Process(const btDbvtNode* leaf)
	{
		int index = leaf->dataAsInt;

		const btCompoundShape* compoundShape = static_cast<const btCompoundShape*>(m_compoundColObjWrap->getCollisionShape());
		const btCollisionShape* childShape = compoundShape->getChildShape(index);

#if 0
		if (m_dispatchInfo.m_debugDraw && (m_dispatchInfo.m_debugDraw->getDebugMode() & btIDebugDraw::DBG_DrawAabb))
		{
			btVector3 worldAabbMin,worldAabbMax;
			btTransform	orgTrans = m_compoundColObjWrap->getWorldTransform();
			btTransformAabb(leaf->volume.Mins(),leaf->volume.Maxs(),0.,orgTrans,worldAabbMin,worldAabbMax);
			m_dispatchInfo.m_debugDraw->drawAabb(worldAabbMin,worldAabbMax,btVector3(1,0,0));
		}
#endif

		ProcessChildShape(childShape,index);

	}